

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFanout.c
# Opt level: O1

void Gia_ManStaticFanoutStart(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  Gia_Obj_t *pGVar5;
  uint *puVar6;
  uint uVar7;
  Vec_Int_t *pVVar8;
  void *__s;
  long lVar9;
  int iVar10;
  long lVar11;
  Gia_Obj_t *pGVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  
  if (p->vFanoutNums != (Vec_Int_t *)0x0) {
    __assert_fail("p->vFanoutNums == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFanout.c"
                  ,0xf4,"void Gia_ManStaticFanoutStart(Gia_Man_t *)");
  }
  if (p->vFanout != (Vec_Int_t *)0x0) {
    __assert_fail("p->vFanout == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFanout.c"
                  ,0xf5,"void Gia_ManStaticFanoutStart(Gia_Man_t *)");
  }
  piVar3 = p->pRefs;
  p->pRefs = (int *)0x0;
  Gia_ManCreateRefs(p);
  piVar4 = p->pRefs;
  iVar10 = p->nObjs;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nSize = iVar10;
  pVVar8->nCap = iVar10;
  pVVar8->pArray = piVar4;
  p->vFanoutNums = pVVar8;
  p->pRefs = piVar3;
  pVVar8 = Gia_ManStartFanoutMap(p,pVVar8);
  p->vFanout = pVVar8;
  uVar1 = p->nObjs;
  uVar7 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar7 = uVar1;
  }
  if (uVar7 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)(int)uVar7 << 2);
  }
  if (__s != (void *)0x0) {
    memset(__s,0,(long)(int)uVar1 * 4);
  }
  uVar7 = p->nObjs;
  uVar14 = uVar7;
  if (0 < (int)uVar7) {
    pGVar5 = p->pObjs;
    lVar9 = 0;
    lVar11 = 0;
    uVar13 = (ulong)uVar7;
    while (uVar14 = uVar7, pGVar5 != (Gia_Obj_t *)0x0) {
      uVar16 = *(ulong *)(&pGVar5->field_0x0 + lVar9) & 0x1fffffff;
      iVar10 = (int)lVar11;
      if (uVar16 != 0x1fffffff) {
        iVar2 = (int)uVar16;
        pGVar12 = (Gia_Obj_t *)(lVar9 + (ulong)(uint)(iVar2 * 4) * -3 + (long)pGVar5);
        if ((pGVar12 < pGVar5) || (pGVar5 + (int)uVar13 <= pGVar12)) goto LAB_00207f72;
        uVar14 = (int)((long)(lVar9 + (ulong)(uint)(iVar2 << 2) * -3) >> 2) * -0x55555555;
        if (((int)uVar14 < 0) || (((int)uVar1 <= (int)uVar14 || (pVVar8->nSize <= (int)uVar14))))
        goto LAB_00207f53;
        if ((int)uVar13 <= lVar11) goto LAB_00207f72;
        uVar15 = pVVar8->pArray[uVar14 & 0x7fffffff] +
                 *(int *)((long)__s + (ulong)(uVar14 & 0x7fffffff) * 4);
        if (((int)uVar15 < 0) || (pVVar8->nSize <= (int)uVar15)) goto LAB_00207fb0;
        pVVar8->pArray[uVar15] = iVar10;
        if (pGVar5 + p->nObjs <= pGVar12) goto LAB_00207f72;
        piVar3 = (int *)((long)__s + (ulong)(uVar14 & 0x7fffffff) * 4);
        *piVar3 = *piVar3 + 1;
      }
      uVar14 = (uint)*(undefined8 *)(&pGVar5->field_0x0 + lVar9);
      if (((~uVar14 & 0x1fffffff) != 0 && -1 < (int)uVar14) &&
         (((uVar15 = (uint)((ulong)*(undefined8 *)(&pGVar5->field_0x0 + lVar9) >> 0x20),
           (int)uVar14 < 0 || ((uVar14 & 0x1fffffff) == 0x1fffffff)) ||
          ((uVar14 & 0x1fffffff) != (uVar15 & 0x1fffffff))))) {
        uVar15 = uVar15 & 0x1fffffff;
        pGVar12 = (Gia_Obj_t *)(lVar9 + (ulong)(uVar15 * 4) * -3 + (long)pGVar5);
        if ((pGVar12 < pGVar5) || (pGVar5 + p->nObjs <= pGVar12)) goto LAB_00207f72;
        uVar14 = (int)((long)(lVar9 + (ulong)(uVar15 << 2) * -3) >> 2) * -0x55555555;
        if (((int)uVar14 < 0) || (((int)uVar1 <= (int)uVar14 || (pVVar8->nSize <= (int)uVar14))))
        goto LAB_00207f53;
        if (p->nObjs <= lVar11) goto LAB_00207f72;
        uVar15 = pVVar8->pArray[uVar14 & 0x7fffffff] +
                 *(int *)((long)__s + (ulong)(uVar14 & 0x7fffffff) * 4);
        if (((int)uVar15 < 0) || (pVVar8->nSize <= (int)uVar15)) goto LAB_00207fb0;
        pVVar8->pArray[uVar15] = iVar10;
        if (pGVar5 + p->nObjs <= pGVar12) goto LAB_00207f72;
        piVar3 = (int *)((long)__s + (ulong)(uVar14 & 0x7fffffff) * 4);
        *piVar3 = *piVar3 + 1;
      }
      iVar2 = p->nObjs;
      if (iVar2 <= lVar11) {
LAB_00207f72:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      puVar6 = p->pMuxes;
      if ((puVar6 != (uint *)0x0) && (puVar6[lVar11] != 0)) {
        if (puVar6 == (uint *)0x0) {
          pGVar12 = (Gia_Obj_t *)0x0;
        }
        else {
          if ((int)puVar6[lVar11] < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          uVar14 = puVar6[lVar11] >> 1;
          if (iVar2 <= (int)uVar14) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          pGVar12 = pGVar5 + uVar14;
        }
        if ((pGVar12 < pGVar5) || (pGVar5 + iVar2 <= pGVar12)) goto LAB_00207f72;
        uVar14 = (int)((long)pGVar12 - (long)pGVar5 >> 2) * -0x55555555;
        if (((int)uVar14 < 0) || (((int)uVar1 <= (int)uVar14 || (pVVar8->nSize <= (int)uVar14))))
        goto LAB_00207f53;
        uVar15 = pVVar8->pArray[uVar14 & 0x7fffffff] +
                 *(int *)((long)__s + (ulong)(uVar14 & 0x7fffffff) * 4);
        if (((int)uVar15 < 0) || (pVVar8->nSize <= (int)uVar15)) {
LAB_00207fb0:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        pVVar8->pArray[uVar15] = iVar10;
        if (pGVar5 + p->nObjs <= pGVar12) goto LAB_00207f72;
        piVar3 = (int *)((long)__s + (ulong)(uVar14 & 0x7fffffff) * 4);
        *piVar3 = *piVar3 + 1;
      }
      lVar11 = lVar11 + 1;
      uVar14 = p->nObjs;
      uVar13 = (ulong)(int)uVar14;
      lVar9 = lVar9 + 0xc;
      if ((long)uVar13 <= lVar11) break;
    }
  }
  if ((0 < (int)uVar14) && (p->pObjs != (Gia_Obj_t *)0x0)) {
    uVar16 = 0;
    uVar13 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar13 = uVar16;
    }
    do {
      if ((uVar13 == uVar16) || ((long)p->vFanoutNums->nSize <= (long)uVar16)) {
LAB_00207f53:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (*(int *)((long)__s + uVar16 * 4) != p->vFanoutNums->pArray[uVar16]) {
        __assert_fail("Vec_IntEntry(vCounts, i) == Gia_ObjFanoutNum(p, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFanout.c"
                      ,0x11a,"void Gia_ManStaticFanoutStart(Gia_Man_t *)");
      }
      uVar16 = uVar16 + 1;
    } while (uVar14 != uVar16);
  }
  if (__s == (void *)0x0) {
    return;
  }
  free(__s);
  return;
}

Assistant:

void Gia_ManStaticFanoutStart( Gia_Man_t * p )
{
    Vec_Int_t * vCounts;
    int * pRefsOld;
    Gia_Obj_t * pObj, * pFanin;
    int i, iFanout;
    assert( p->vFanoutNums == NULL );
    assert( p->vFanout == NULL );
    // recompute reference counters
    pRefsOld = p->pRefs; p->pRefs = NULL;
    Gia_ManCreateRefs(p);
    p->vFanoutNums = Vec_IntAllocArray( p->pRefs, Gia_ManObjNum(p) );
    p->pRefs = pRefsOld;
    // start the fanout maps
    p->vFanout = Gia_ManStartFanoutMap( p, p->vFanoutNums );
    // incrementally add fanouts
    vCounts = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) || Gia_ObjIsCo(pObj) )
        {
            pFanin = Gia_ObjFanin0(pObj);
            iFanout = Vec_IntEntry( vCounts, Gia_ObjId(p, pFanin) );
            Gia_ObjSetFanout( p, pFanin, iFanout, pObj );
            Vec_IntAddToEntry( vCounts, Gia_ObjId(p, pFanin), 1 );
        }
        if ( Gia_ObjIsAnd(pObj) && !Gia_ObjIsBuf(pObj) )
        {
            pFanin = Gia_ObjFanin1(pObj);
            iFanout = Vec_IntEntry( vCounts, Gia_ObjId(p, pFanin) );
            Gia_ObjSetFanout( p, pFanin, iFanout, pObj );
            Vec_IntAddToEntry( vCounts, Gia_ObjId(p, pFanin), 1 );
        }
        if ( Gia_ObjIsMux(p, pObj) )
        {

            pFanin = Gia_ObjFanin2(p, pObj);
            iFanout = Vec_IntEntry( vCounts, Gia_ObjId(p, pFanin) );
            Gia_ObjSetFanout( p, pFanin, iFanout, pObj );
            Vec_IntAddToEntry( vCounts, Gia_ObjId(p, pFanin), 1 );
        }
    }
    // double-check the current number of fanouts added
    Gia_ManForEachObj( p, pObj, i )
        assert( Vec_IntEntry(vCounts, i) == Gia_ObjFanoutNum(p, pObj) );
    Vec_IntFree( vCounts );
}